

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-iso8601.c
# Opt level: O2

void test_date(char *str,int64_t millis)

{
  char cVar1;
  size_t sVar2;
  char *__format;
  int64_t v;
  bson_error_t error;
  long local_220;
  undefined1 local_218 [512];
  
  sVar2 = strlen(str);
  cVar1 = _bson_iso8601_date_parse(str,sVar2 & 0xffffffff,&local_220,local_218);
  if (cVar1 == '\0') {
    __format = "could not parse (%s)\n";
  }
  else {
    if (local_220 == millis) {
      return;
    }
    fprintf(_stderr,"parsed value not correct: %ld != %ld\n",millis);
    __format = "parsing: [%s]\n";
  }
  fprintf(_stderr,__format,str);
  abort();
}

Assistant:

static void
test_date (const char *str, int64_t millis)
{
   int64_t v;
   bson_error_t error;

   if (!_bson_iso8601_date_parse (str, strlen (str), &v, &error)) {
      fprintf (stderr, "could not parse (%s)\n", str);
      abort ();
   }

   if (v != millis) {
      fprintf (stderr,
               "parsed value not correct: %" PRId64 " != %" PRId64 "\n",
               millis,
               v);

      fprintf (stderr, "parsing: [%s]\n", str);
      abort ();
   }
}